

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O3

char * xe::getTestCaseTypeName(TestCaseType caseType)

{
  if (caseType < TESTCASETYPE_LAST) {
    return &DAT_0012c4d8 + *(int *)(&DAT_0012c4d8 + (ulong)caseType * 4);
  }
  return (char *)0x0;
}

Assistant:

const char* getTestCaseTypeName (TestCaseType caseType)
{
	switch (caseType)
	{
		case TESTCASETYPE_SELF_VALIDATE:	return "SelfValidate";
		case TESTCASETYPE_CAPABILITY:		return "Capability";
		case TESTCASETYPE_ACCURACY:			return "Accuracy";
		case TESTCASETYPE_PERFORMANCE:		return "Performance";
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}